

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_String.cc
# Opt level: O3

void __thiscall Pl_String::Pl_String(Pl_String *this,char *identifier,Pipeline *next,string *s)

{
  Members *pMVar1;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_String_002eb8c0;
  pMVar1 = (Members *)operator_new(8);
  pMVar1->s = s;
  (this->m)._M_t.super___uniq_ptr_impl<Pl_String::Members,_std::default_delete<Pl_String::Members>_>
  ._M_t.super__Tuple_impl<0UL,_Pl_String::Members_*,_std::default_delete<Pl_String::Members>_>.
  super__Head_base<0UL,_Pl_String::Members_*,_false>._M_head_impl = pMVar1;
  return;
}

Assistant:

Pl_String::Pl_String(char const* identifier, Pipeline* next, std::string& s) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>(s))
{
}